

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_typename.cpp
# Opt level: O3

LogicalType * __thiscall
duckdb::Transformer::TransformTypeNameInternal
          (LogicalType *__return_storage_ptr__,Transformer *this,PGTypeName *type_name)

{
  shared_ptr<duckdb::ExtraTypeInfo,_true> *psVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  LogicalTypeId LVar5;
  reference pvVar6;
  iterator iVar7;
  unsigned_long uVar8;
  PGList *pPVar9;
  ParserException *pPVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong val;
  _Alloc_hider _Var12;
  LogicalType *pLVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  *this_00;
  PGListCell *pPVar14;
  undefined8 *puVar15;
  ulong uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  ulong uVar18;
  ulong val_00;
  string_t sVar19;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  case_insensitive_set_t name_collision_set;
  vector<duckdb::Value,_true> type_mods;
  optional_ptr<duckdb_libpgquery::PGTypeName,_true> entry_type_node;
  optional_ptr<duckdb_libpgquery::PGValue,_true> entry_name_node;
  child_list_t<LogicalType> children;
  LogicalType entry_type;
  uint8_t in_stack_fffffffffffffcad;
  uint8_t in_stack_fffffffffffffcae;
  undefined1 local_348 [32];
  LogicalType local_328;
  LogicalType *local_308;
  undefined1 local_300 [8];
  LogicalType local_2f8;
  float local_2e0;
  undefined4 uStack_2dc;
  PGList *local_2d8;
  __node_base_ptr p_Stack_2d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2a0;
  undefined1 local_298 [40];
  Transformer *local_270;
  optional_ptr<duckdb_libpgquery::PGTypeName,_true> local_268;
  optional_ptr<duckdb_libpgquery::PGValue,_true> local_260;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  local_258;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  child_list_t<LogicalType> local_1a0;
  LogicalType local_188;
  LogicalType local_170;
  string local_158;
  child_list_t<LogicalType> local_138;
  vector<duckdb::Value,_true> local_118;
  vector<duckdb::Value,_true> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  LogicalType local_c0;
  LogicalType local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pPVar9 = type_name->names;
  local_308 = __return_storage_ptr__;
  if (1 < pPVar9->length) {
    local_348._0_8_ = (pointer)0x0;
    local_348._8_8_ = (pointer)0x0;
    local_348._16_8_ = (pointer)0x0;
    pPVar14 = pPVar9->head;
    local_270 = this;
    if (pPVar14 != (PGListCell *)0x0) {
      do {
        local_298._0_8_ = (pPVar14->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_298);
        ::std::__cxx11::string::string
                  ((string *)local_300,(char *)((ValUnion *)(local_298._0_8_ + 8))->str,
                   (allocator *)&local_258);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_348,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300);
        if (local_300 != (undefined1  [8])&local_2f8.type_info_) {
          operator_delete((void *)local_300);
        }
        pPVar14 = pPVar14->next;
      } while (pPVar14 != (PGListCell *)0x0);
    }
    TransformTypeModifiers((vector<duckdb::Value,_true> *)local_298,local_270,type_name);
    iVar2 = type_name->names->length;
    if (iVar2 == 2) {
      paVar17 = &local_158.field_2;
      local_158._M_dataplus._M_p = (pointer)paVar17;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_158);
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_348,0);
      pLVar13 = local_308;
      local_200._M_dataplus._M_p = (pvVar6->_M_dataplus)._M_p;
      paVar11 = &pvVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p == paVar11) {
        local_200.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_200.field_2._8_8_ = *(undefined8 *)((long)&pvVar6->field_2 + 8);
        local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      }
      else {
        local_200.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_200._M_string_length = pvVar6->_M_string_length;
      (pvVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pvVar6->_M_string_length = 0;
      (pvVar6->field_2)._M_local_buf[0] = '\0';
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_348,1);
      local_1c0._M_dataplus._M_p = (pvVar6->_M_dataplus)._M_p;
      paVar11 = &pvVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p == paVar11) {
        local_1c0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_1c0.field_2._8_8_ = *(undefined8 *)((long)&pvVar6->field_2 + 8);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      }
      else {
        local_1c0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_1c0._M_string_length = pvVar6->_M_string_length;
      (pvVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pvVar6->_M_string_length = 0;
      (pvVar6->field_2)._M_local_buf[0] = '\0';
      local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_298._0_8_;
      local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_298._8_8_;
      local_f8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_298._16_8_;
      local_298._16_8_ = (pointer)0x0;
      local_298._0_8_ = (PGValue *)0x0;
      local_298._8_8_ = (pointer)0x0;
      LogicalType::USER(pLVar13,&local_158,&local_200,&local_1c0,&local_f8);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      _Var12._M_p = local_158._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
        _Var12._M_p = local_158._M_dataplus._M_p;
      }
    }
    else {
      if (iVar2 != 3) {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        local_300 = (undefined1  [8])&local_2f8.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_300,
                   "Too many qualifications for type name - expected [catalog.schema.name] or [schema.name]"
                   ,"");
        ParserException::ParserException(pPVar10,(string *)local_300);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_348,0);
      pLVar13 = local_308;
      paVar17 = &local_220.field_2;
      local_220._M_dataplus._M_p = (pvVar6->_M_dataplus)._M_p;
      paVar11 = &pvVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p == paVar11) {
        local_220.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_220.field_2._8_8_ = *(undefined8 *)((long)&pvVar6->field_2 + 8);
        local_220._M_dataplus._M_p = (pointer)paVar17;
      }
      else {
        local_220.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_220._M_string_length = pvVar6->_M_string_length;
      (pvVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pvVar6->_M_string_length = 0;
      (pvVar6->field_2)._M_local_buf[0] = '\0';
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_348,1);
      local_240._M_dataplus._M_p = (pvVar6->_M_dataplus)._M_p;
      paVar11 = &pvVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p == paVar11) {
        local_240.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_240.field_2._8_8_ = *(undefined8 *)((long)&pvVar6->field_2 + 8);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      }
      else {
        local_240.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_240._M_string_length = pvVar6->_M_string_length;
      (pvVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pvVar6->_M_string_length = 0;
      (pvVar6->field_2)._M_local_buf[0] = '\0';
      pvVar6 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                             *)local_348,2);
      local_1e0._M_dataplus._M_p = (pvVar6->_M_dataplus)._M_p;
      paVar11 = &pvVar6->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p == paVar11) {
        local_1e0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_1e0.field_2._8_8_ = *(undefined8 *)((long)&pvVar6->field_2 + 8);
        local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
      }
      else {
        local_1e0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
      }
      local_1e0._M_string_length = pvVar6->_M_string_length;
      (pvVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pvVar6->_M_string_length = 0;
      (pvVar6->field_2)._M_local_buf[0] = '\0';
      local_118.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_298._0_8_;
      local_118.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_298._8_8_;
      local_118.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_298._16_8_;
      local_298._16_8_ = (pointer)0x0;
      local_298._0_8_ = (PGValue *)0x0;
      local_298._8_8_ = (pointer)0x0;
      LogicalType::USER(pLVar13,&local_220,&local_240,&local_1e0,&local_118);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      _Var12._M_p = local_220._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p);
        _Var12._M_p = local_220._M_dataplus._M_p;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var12._M_p != paVar17) {
      operator_delete(_Var12._M_p);
    }
    ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
              ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_298);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_348);
    return pLVar13;
  }
  local_300 = (undefined1  [8])(pPVar9->tail->data).ptr_value;
  optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
            ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_300);
  pcVar3 = *(char **)((long)local_300 + 8);
  ::std::__cxx11::string::string((string *)local_300,pcVar3,(allocator *)local_348);
  LVar5 = TransformStringToLogicalTypeId((string *)local_300);
  psVar1 = &local_2f8.type_info_;
  if (local_300 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_300);
  }
  local_270 = (Transformer *)(ulong)LVar5;
  switch(LVar5) {
  case STRUCT:
    pPVar9 = type_name->typmods;
    if ((pPVar9 == (PGList *)0x0) || (pPVar9->length == 0)) {
      pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
      local_300 = (undefined1  [8])psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_300,"Struct needs a name and entries","");
      ParserException::ParserException(pPVar10,(string *)local_300);
      __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_300 = (undefined1  [8])&p_Stack_2d0;
    local_2f8._0_8_ = &DAT_00000001;
    local_2f8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2f8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2e0 = 1.0;
    local_2d8 = (PGList *)0x0;
    p_Stack_2d0 = (__node_base_ptr)0x0;
    pPVar14 = pPVar9->head;
    if (pPVar14 != (PGListCell *)0x0) {
      do {
        local_348._0_8_ = (pPVar14->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_348);
        if (*(int *)(local_348._0_8_ + 4) != 2) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_348._0_8_ = local_348 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"Struct entry needs an entry name and a type name","");
          ParserException::ParserException(pPVar10,(string *)local_348);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_260.ptr = (PGValue *)**(long **)(local_348._0_8_ + 8);
        local_268.ptr = (PGTypeName *)**(undefined8 **)(local_348._0_8_ + 0x10);
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_260);
        ::std::__cxx11::string::string
                  ((string *)local_298,((local_260.ptr)->val).str,(allocator *)local_348);
        iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_300,(key_type *)local_298);
        if (iVar7.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_348._0_8_ = local_348 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"Duplicate struct entry name \"%s\"","");
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,local_298._0_8_,
                     (pointer)(local_298._0_8_ + (long)(LogicalType *)local_298._8_8_));
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar10,(string *)local_348,&local_90);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_348._0_8_ = (PGTypeName *)local_300;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_300,(key_type *)local_298,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_348);
        optional_ptr<duckdb_libpgquery::PGTypeName,_true>::CheckValid(&local_268);
        TransformTypeName(&local_188,this,local_268.ptr);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_348,(key_type *)local_298,&local_188);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_258,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_348);
        LogicalType::~LogicalType(&local_328);
        if ((PGTypeName *)local_348._0_8_ != (PGTypeName *)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_);
        }
        LogicalType::~LogicalType(&local_188);
        if ((PGTypeName *)local_298._0_8_ != (PGTypeName *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_);
        }
        pPVar14 = pPVar14->next;
      } while (pPVar14 != (PGListCell *)0x0);
    }
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
              *)&local_1a0,&local_258);
    pLVar13 = local_308;
    LogicalType::STRUCT(local_308,&local_1a0);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_1a0;
    break;
  case LIST:
    pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
    local_300 = (undefined1  [8])psVar1;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_300,"LIST is not valid as a stand-alone type","");
    ParserException::ParserException(pPVar10,(string *)local_300);
    __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
  case MAP:
    pPVar9 = type_name->typmods;
    if ((pPVar9 == (PGList *)0x0) || (pPVar9->length != 2)) {
      pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
      local_300 = (undefined1  [8])psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_300,"Map type needs exactly two entries, key and value type","");
      ParserException::ParserException(pPVar10,(string *)local_300);
      __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_348._0_8_ = (pPVar9->head->data).ptr_value;
    optional_ptr<duckdb_libpgquery::PGTypeName,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGTypeName,_true> *)local_348);
    TransformTypeName((LogicalType *)local_300,this,(PGTypeName *)local_348._0_8_);
    local_298._0_8_ = (type_name->typmods->tail->data).ptr_value;
    optional_ptr<duckdb_libpgquery::PGTypeName,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGTypeName,_true> *)local_298);
    TransformTypeName((LogicalType *)local_348,this,(PGTypeName *)local_298._0_8_);
    LogicalType::LogicalType(&local_a8,(LogicalType *)local_300);
    LogicalType::LogicalType(&local_c0,(LogicalType *)local_348);
    LogicalType::MAP(__return_storage_ptr__,&local_a8,&local_c0);
    LogicalType::~LogicalType(&local_c0);
    LogicalType::~LogicalType(&local_a8);
    LogicalType::~LogicalType((LogicalType *)local_348);
    pLVar13 = (LogicalType *)local_300;
    goto LAB_01261ff9;
  case ENUM:
    if ((type_name->typmods == (PGList *)0x0) || (type_name->typmods->length == 0)) {
      pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
      local_300 = (undefined1  [8])psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_300,"Enum needs a set of entries","");
      ParserException::ParserException(pPVar10,(string *)local_300);
      __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType(&local_170,VARCHAR);
    uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert(type_name->typmods->length);
    Vector::Vector((Vector *)local_300,&local_170,uVar8);
    LogicalType::~LogicalType(&local_170);
    pPVar9 = type_name->typmods;
    pPVar14 = pPVar9->head;
    if (pPVar14 != (PGListCell *)0x0) {
      puVar15 = (undefined8 *)(CONCAT44(uStack_2dc,local_2e0) + 8);
      do {
        local_298._0_8_ = (pPVar14->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_298);
        if ((*(int *)local_298._0_8_ != 0x164) ||
           (optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
                      ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_298),
           *(int *)(local_298._0_8_ + 8) != 0xdb)) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_348._0_8_ = local_348 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"Enum type requires a set of strings as type modifiers","")
          ;
          ParserException::ParserException(pPVar10,(string *)local_348);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_298);
        sVar19 = StringVector::AddString((Vector *)local_300,*(char **)(local_298._0_8_ + 0x10));
        puVar15[-1] = sVar19.value._0_8_;
        *puVar15 = sVar19.value._8_8_;
        pPVar14 = pPVar14->next;
        puVar15 = puVar15 + 2;
      } while (pPVar14 != (PGListCell *)0x0);
      pPVar9 = type_name->typmods;
    }
    uVar8 = NumericCastImpl<unsigned_long,_int,_false>::Convert(pPVar9->length);
    LogicalType::ENUM(__return_storage_ptr__,(Vector *)local_300,uVar8);
    if (local_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2a0._M_pi);
    }
    if (local_2b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b0._M_pi);
    }
    if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
    }
    pLVar13 = &local_2f8;
LAB_01261ff9:
    LogicalType::~LogicalType(pLVar13);
    return __return_storage_ptr__;
  case UNION:
    pPVar9 = type_name->typmods;
    if ((pPVar9 == (PGList *)0x0) || (pPVar9->length == 0)) {
      pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
      local_300 = (undefined1  [8])psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_300,"Union type needs at least one member","");
      ParserException::ParserException(pPVar10,(string *)local_300);
      __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (0x100 < pPVar9->length) {
      pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
      local_300 = (undefined1  [8])psVar1;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_300,"Union types can have at most %d members","");
      ParserException::ParserException<unsigned_long>(pPVar10,(string *)local_300,0x100);
      __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_300 = (undefined1  [8])&p_Stack_2d0;
    local_2f8._0_8_ = &DAT_00000001;
    local_2f8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_2f8.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_2e0 = 1.0;
    local_2d8 = (PGList *)0x0;
    p_Stack_2d0 = (__node_base_ptr)0x0;
    pPVar14 = pPVar9->head;
    if (pPVar14 == (PGListCell *)0x0) {
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
    }
    else {
      do {
        local_348._0_8_ = (pPVar14->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_348);
        if (*(int *)(local_348._0_8_ + 4) != 2) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_348._0_8_ = local_348 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"Union type member needs a tag name and a type name","");
          ParserException::ParserException(pPVar10,(string *)local_348);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_260.ptr = (PGValue *)**(long **)(local_348._0_8_ + 8);
        local_268.ptr = (PGTypeName *)**(undefined8 **)(local_348._0_8_ + 0x10);
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_260);
        ::std::__cxx11::string::string
                  ((string *)local_298,((local_260.ptr)->val).str,(allocator *)local_348);
        iVar7 = ::std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                        *)local_300,(key_type *)local_298);
        if (iVar7.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_348._0_8_ = local_348 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_348,"Duplicate union type tag name \"%s\"","");
          local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e0,local_298._0_8_,
                     (pointer)(local_298._0_8_ + (long)(LogicalType *)local_298._8_8_));
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar10,(string *)local_348,&local_e0);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_348._0_8_ = (PGTypeName *)local_300;
        ::std::
        _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_300,(key_type *)local_298,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_348);
        optional_ptr<duckdb_libpgquery::PGTypeName,_true>::CheckValid(&local_268);
        TransformTypeName(&local_188,this,local_268.ptr);
        ::std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_duckdb::LogicalType_&,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_348,(key_type *)local_298,&local_188);
        ::std::
        vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
        ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                  ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                    *)&local_258,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                    *)local_348);
        LogicalType::~LogicalType(&local_328);
        if ((PGTypeName *)local_348._0_8_ != (PGTypeName *)(local_348 + 0x10)) {
          operator_delete((void *)local_348._0_8_);
        }
        LogicalType::~LogicalType(&local_188);
        if ((PGTypeName *)local_298._0_8_ != (PGTypeName *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_);
        }
        pPVar14 = pPVar14->next;
      } while (pPVar14 != (PGListCell *)0x0);
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_258.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ =
           local_258.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_start._0_4_;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_start._4_4_ =
           local_258.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_start._4_4_;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           local_258.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish._0_4_;
      local_138.
      super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      .
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
           local_258.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish._4_4_;
    }
    pLVar13 = local_308;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LogicalType::UNION(local_308,&local_138);
    this_00 = (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
               *)&local_138;
    break;
  default:
    if (LVar5 == USER) {
      ::std::__cxx11::string::string((string *)local_300,pcVar3,(allocator *)local_348);
      TransformTypeModifiers((vector<duckdb::Value,_true> *)local_348,this,type_name);
      LogicalType::USER(__return_storage_ptr__,(string *)local_300,
                        (vector<duckdb::Value,_true> *)local_348);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::~vector
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)local_348);
      if (local_300 == (undefined1  [8])psVar1) {
        return __return_storage_ptr__;
      }
      operator_delete((void *)local_300);
      return __return_storage_ptr__;
    }
  case TABLE:
  case AGGREGATE_STATE:
  case LAMBDA:
    uVar16 = 0;
    val_00 = (ulong)(LVar5 == DECIMAL) * 3;
    val = 0x12;
    if (LVar5 != DECIMAL) {
      val = uVar16;
    }
    if (type_name->typmods != (PGList *)0x0) {
      pPVar14 = type_name->typmods->head;
      uVar16 = 0;
      if (pPVar14 != (PGListCell *)0x0) {
        uVar18 = val_00;
        do {
          local_300 = (undefined1  [8])(pPVar14->data).ptr_value;
          optional_ptr<duckdb_libpgquery::PGAConst,_true>::CheckValid
                    ((optional_ptr<duckdb_libpgquery::PGAConst,_true> *)local_300);
          if ((*(int *)local_300 != 0x164) || (*(int *)((long)local_300 + 8) != 0xd9)) {
            pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
            local_300 = (undefined1  [8])&local_2f8.type_info_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_300,"Expected an integer constant as type modifier","");
            ParserException::ParserException(pPVar10,(string *)local_300);
            __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          uVar4 = *(ulong *)((long)local_300 + 0x10);
          if ((long)uVar4 < 0) {
            pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
            local_300 = (undefined1  [8])&local_2f8.type_info_;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_300,"Negative modifier not supported","");
            ParserException::ParserException(pPVar10,(string *)local_300);
            __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
          }
          val_00 = uVar4;
          if (uVar16 != 1) {
            if (uVar16 != 0) {
              pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
              local_300 = (undefined1  [8])&local_2f8.type_info_;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_300,"A maximum of two modifiers is supported","");
              ParserException::ParserException(pPVar10,(string *)local_300);
              __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
            }
            val = uVar4;
            if (*(int *)((long)local_300 + 0x18) != -1) {
              val = 0;
            }
            val_00 = uVar18;
            if (LVar5 != BIT) {
              val = uVar4;
            }
          }
          uVar16 = uVar16 + 1;
          pPVar14 = pPVar14->next;
          uVar18 = val_00;
        } while (pPVar14 != (PGListCell *)0x0);
      }
    }
    pLVar13 = local_308;
    switch((int)local_270) {
    case 0x13:
      if (uVar16 == 1) {
        if (10 < (long)val) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_300 = (undefined1  [8])&local_2f8.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_300,"TIMESTAMP only supports until nano-second precision (9)",
                     "");
          ParserException::ParserException(pPVar10,(string *)local_300);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if (val == 0) {
          LVar5 = TIMESTAMP_SEC;
          break;
        }
        if ((long)val < 4) {
          LVar5 = TIMESTAMP_MS;
          break;
        }
        if (6 < val) {
          LVar5 = TIMESTAMP_NS;
          break;
        }
      }
      else if (uVar16 != 0) {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        local_300 = (undefined1  [8])&local_2f8.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_300,"TIMESTAMP only supports a single modifier","");
        ParserException::ParserException(pPVar10,(string *)local_300);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LVar5 = TIMESTAMP;
      break;
    case 0x15:
      if (uVar16 == 1) {
        val_00 = 0;
      }
      if (0xffffffffffffffd9 < val - 0x27) {
        if ((long)val_00 <= (long)val) {
          NumericCastImpl<unsigned_char,_long,_false>::Convert(val);
          NumericCastImpl<unsigned_char,_long,_false>::Convert(val_00);
          LogicalType::DECIMAL(in_stack_fffffffffffffcae,in_stack_fffffffffffffcad);
          return pLVar13;
        }
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        local_300 = (undefined1  [8])&local_2f8.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_300,"Scale cannot be bigger than width","");
        ParserException::ParserException(pPVar10,(string *)local_300);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
      local_300 = (undefined1  [8])&local_2f8.type_info_;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_300,"Width must be between 1 and %d!","");
      ParserException::ParserException<int>(pPVar10,(string *)local_300,0x26);
      __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    case 0x19:
      if (1 < uVar16) {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        local_300 = (undefined1  [8])&local_2f8.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_300,"VARCHAR only supports a single modifier","");
        ParserException::ParserException(pPVar10,(string *)local_300);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LVar5 = VARCHAR;
      break;
    case 0x1b:
      if (1 < uVar16) {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        local_300 = (undefined1  [8])&local_2f8.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_300,"INTERVAL only supports a single modifier","");
        ParserException::ParserException(pPVar10,(string *)local_300);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LVar5 = INTERVAL;
      break;
    default:
      if ((int)local_270 == 0x24) {
        if ((val == 0) && (type_name->typmods != (PGList *)0x0)) {
          pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
          local_300 = (undefined1  [8])&local_2f8.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_300,"Type %s does not support any modifiers!","");
          LogicalType::LogicalType((LogicalType *)local_348,BIT);
          LogicalType::ToString_abi_cxx11_(&local_50,(LogicalType *)local_348);
          ParserException::ParserException<std::__cxx11::string>
                    (pPVar10,(string *)local_300,&local_50);
          __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        LVar5 = BIT;
        break;
      }
    case 0x14:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x1a:
      if (uVar16 != 0) {
        pPVar10 = (ParserException *)__cxa_allocate_exception(0x10);
        local_300 = (undefined1  [8])&local_2f8.type_info_;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_300,"Type %s does not support any modifiers!","");
        LogicalType::LogicalType((LogicalType *)local_348,(LogicalTypeId)local_270);
        LogicalType::ToString_abi_cxx11_(&local_70,(LogicalType *)local_348);
        ParserException::ParserException<std::__cxx11::string>
                  (pPVar10,(string *)local_300,&local_70);
        __cxa_throw(pPVar10,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
      }
      LVar5 = (LogicalTypeId)local_270;
    }
    LogicalType::LogicalType(local_308,LVar5);
    return pLVar13;
  }
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector(this_00);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_300);
  ::std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
             *)&local_258);
  return pLVar13;
}

Assistant:

LogicalType Transformer::TransformTypeNameInternal(duckdb_libpgquery::PGTypeName &type_name) {
	if (type_name.names->length > 1) {
		// qualified typename
		vector<string> names;
		for (auto cell = type_name.names->head; cell; cell = cell->next) {
			names.push_back(PGPointerCast<duckdb_libpgquery::PGValue>(cell->data.ptr_value)->val.str);
		}
		vector<Value> type_mods = TransformTypeModifiers(type_name);
		switch (type_name.names->length) {
		case 2: {
			return LogicalType::USER(INVALID_CATALOG, std::move(names[0]), std::move(names[1]), std::move(type_mods));
		}
		case 3: {
			return LogicalType::USER(std::move(names[0]), std::move(names[1]), std::move(names[2]),
			                         std::move(type_mods));
		}
		default:
			throw ParserException(
			    "Too many qualifications for type name - expected [catalog.schema.name] or [schema.name]");
		}
	}

	auto name = PGPointerCast<duckdb_libpgquery::PGValue>(type_name.names->tail->data.ptr_value)->val.str;
	// transform it to the SQL type
	LogicalTypeId base_type = TransformStringToLogicalTypeId(name);

	if (base_type == LogicalTypeId::LIST) {
		throw ParserException("LIST is not valid as a stand-alone type");
	}
	if (base_type == LogicalTypeId::ENUM) {
		if (!type_name.typmods || type_name.typmods->length == 0) {
			throw ParserException("Enum needs a set of entries");
		}
		Vector enum_vector(LogicalType::VARCHAR, NumericCast<idx_t>(type_name.typmods->length));
		auto string_data = FlatVector::GetData<string_t>(enum_vector);
		idx_t pos = 0;
		for (auto node = type_name.typmods->head; node; node = node->next) {
			auto constant_value = PGPointerCast<duckdb_libpgquery::PGAConst>(node->data.ptr_value);
			if (constant_value->type != duckdb_libpgquery::T_PGAConst ||
			    constant_value->val.type != duckdb_libpgquery::T_PGString) {
				throw ParserException("Enum type requires a set of strings as type modifiers");
			}
			string_data[pos++] = StringVector::AddString(enum_vector, constant_value->val.val.str);
		}
		return LogicalType::ENUM(enum_vector, NumericCast<idx_t>(type_name.typmods->length));
	}
	if (base_type == LogicalTypeId::STRUCT) {
		if (!type_name.typmods || type_name.typmods->length == 0) {
			throw ParserException("Struct needs a name and entries");
		}
		child_list_t<LogicalType> children;
		case_insensitive_set_t name_collision_set;

		for (auto node = type_name.typmods->head; node; node = node->next) {
			auto &type_val = *PGPointerCast<duckdb_libpgquery::PGList>(node->data.ptr_value);
			if (type_val.length != 2) {
				throw ParserException("Struct entry needs an entry name and a type name");
			}

			auto entry_name_node = PGPointerCast<duckdb_libpgquery::PGValue>(type_val.head->data.ptr_value);
			D_ASSERT(entry_name_node->type == duckdb_libpgquery::T_PGString);
			auto entry_type_node = PGPointerCast<duckdb_libpgquery::PGTypeName>(type_val.tail->data.ptr_value);
			D_ASSERT(entry_type_node->type == duckdb_libpgquery::T_PGTypeName);

			auto entry_name = string(entry_name_node->val.str);
			D_ASSERT(!entry_name.empty());

			if (name_collision_set.find(entry_name) != name_collision_set.end()) {
				throw ParserException("Duplicate struct entry name \"%s\"", entry_name);
			}
			name_collision_set.insert(entry_name);
			auto entry_type = TransformTypeName(*entry_type_node);

			children.push_back(make_pair(entry_name, entry_type));
		}
		D_ASSERT(!children.empty());
		return LogicalType::STRUCT(children);
	}
	if (base_type == LogicalTypeId::MAP) {
		if (!type_name.typmods || type_name.typmods->length != 2) {
			throw ParserException("Map type needs exactly two entries, key and value type");
		}
		auto key_type =
		    TransformTypeName(*PGPointerCast<duckdb_libpgquery::PGTypeName>(type_name.typmods->head->data.ptr_value));
		auto value_type =
		    TransformTypeName(*PGPointerCast<duckdb_libpgquery::PGTypeName>(type_name.typmods->tail->data.ptr_value));

		return LogicalType::MAP(std::move(key_type), std::move(value_type));
	}
	if (base_type == LogicalTypeId::UNION) {
		if (!type_name.typmods || type_name.typmods->length == 0) {
			throw ParserException("Union type needs at least one member");
		}
		if (type_name.typmods->length > (int)UnionType::MAX_UNION_MEMBERS) {
			throw ParserException("Union types can have at most %d members", UnionType::MAX_UNION_MEMBERS);
		}

		child_list_t<LogicalType> children;
		case_insensitive_set_t name_collision_set;

		for (auto node = type_name.typmods->head; node; node = node->next) {
			auto &type_val = *PGPointerCast<duckdb_libpgquery::PGList>(node->data.ptr_value);
			if (type_val.length != 2) {
				throw ParserException("Union type member needs a tag name and a type name");
			}

			auto entry_name_node = PGPointerCast<duckdb_libpgquery::PGValue>(type_val.head->data.ptr_value);
			D_ASSERT(entry_name_node->type == duckdb_libpgquery::T_PGString);
			auto entry_type_node = PGPointerCast<duckdb_libpgquery::PGTypeName>(type_val.tail->data.ptr_value);
			D_ASSERT(entry_type_node->type == duckdb_libpgquery::T_PGTypeName);

			auto entry_name = string(entry_name_node->val.str);
			D_ASSERT(!entry_name.empty());

			if (name_collision_set.find(entry_name) != name_collision_set.end()) {
				throw ParserException("Duplicate union type tag name \"%s\"", entry_name);
			}

			name_collision_set.insert(entry_name);

			auto entry_type = TransformTypeName(*entry_type_node);
			children.push_back(make_pair(entry_name, entry_type));
		}
		D_ASSERT(!children.empty());
		return LogicalType::UNION(std::move(children));
	}
	if (base_type == LogicalTypeId::USER) {
		string user_type_name {name};
		vector<Value> type_mods = TransformTypeModifiers(type_name);
		return LogicalType::USER(user_type_name, type_mods);
	}

	SizeModifiers modifiers = GetSizeModifiers(type_name, base_type);
	switch (base_type) {
	case LogicalTypeId::VARCHAR:
		if (modifiers.count > 1) {
			throw ParserException("VARCHAR only supports a single modifier");
		}
		// FIXME: create CHECK constraint based on varchar width
		modifiers.width = 0;
		return LogicalType::VARCHAR;
	case LogicalTypeId::DECIMAL:
		if (modifiers.count > 2) {
			throw ParserException("DECIMAL only supports a maximum of two modifiers");
		}
		if (modifiers.count == 1) {
			// only width is provided: set scale to 0
			modifiers.scale = 0;
		}
		if (modifiers.width <= 0 || modifiers.width > Decimal::MAX_WIDTH_DECIMAL) {
			throw ParserException("Width must be between 1 and %d!", (int)Decimal::MAX_WIDTH_DECIMAL);
		}
		if (modifiers.scale > modifiers.width) {
			throw ParserException("Scale cannot be bigger than width");
		}
		return LogicalType::DECIMAL(NumericCast<uint8_t>(modifiers.width), NumericCast<uint8_t>(modifiers.scale));
	case LogicalTypeId::INTERVAL:
		if (modifiers.count > 1) {
			throw ParserException("INTERVAL only supports a single modifier");
		}
		modifiers.width = 0;
		return LogicalType::INTERVAL;
	case LogicalTypeId::BIT:
		if (!modifiers.width && type_name.typmods) {
			throw ParserException("Type %s does not support any modifiers!", LogicalType(base_type).ToString());
		}
		return LogicalType(base_type);
	case LogicalTypeId::TIMESTAMP:
		if (modifiers.count == 0) {
			return LogicalType::TIMESTAMP;
		}
		if (modifiers.count > 1) {
			throw ParserException("TIMESTAMP only supports a single modifier");
		}
		if (modifiers.width > 10) {
			throw ParserException("TIMESTAMP only supports until nano-second precision (9)");
		}
		if (modifiers.width == 0) {
			return LogicalType::TIMESTAMP_S;
		}
		if (modifiers.width <= 3) {
			return LogicalType::TIMESTAMP_MS;
		}
		if (modifiers.width <= 6) {
			return LogicalType::TIMESTAMP;
		}
		return LogicalType::TIMESTAMP_NS;
	default:
		if (modifiers.count > 0) {
			throw ParserException("Type %s does not support any modifiers!", LogicalType(base_type).ToString());
		}
		return LogicalType(base_type);
	}
}